

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  char *pcVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  cmGlobalGenerator *this_00;
  string fname;
  cmGeneratedFileStream fout;
  char *local_2a8 [4];
  undefined1 local_288 [32];
  
  pcVar1 = cmMakefile::GetHomeOutputDirectory
                     ((*(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->Makefile);
  std::__cxx11::string::string((string *)local_2a8,pcVar1,(allocator *)&stack0xfffffffffffffd98);
  std::__cxx11::string::append((char *)local_2a8);
  std::__cxx11::string::append((char *)local_2a8);
  this_00 = (cmGlobalGenerator *)&stack0xfffffffffffffd98;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)this_00,local_2a8[0],false);
  p_Var3 = &(this->TotalTargets)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    if (((cmTarget *)p_Var3[5]._M_nxt)->TargetTypeValue != INTERFACE_LIBRARY) {
      WriteSummary(this_00,(cmTarget *)p_Var3[5]._M_nxt);
      cmTarget::GetSupportDirectory_abi_cxx11_((string *)local_288,(cmTarget *)p_Var3[5]._M_nxt);
      poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffd98,(string *)local_288);
      std::operator<<(poVar2,"\n");
      this_00 = (cmGlobalGenerator *)local_288;
      std::__cxx11::string::~string((string *)local_288);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&stack0xfffffffffffffd98);
  std::__cxx11::string::~string((string *)local_2a8);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  cmMakefile* mf = this->LocalGenerators[0]->GetMakefile();

  // Record all target directories in a central location.
  std::string fname = mf->GetHomeOutputDirectory();
  fname += cmake::GetCMakeFilesDirectory();
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname.c_str());

  // Generate summary information files for each target.
  for(TargetMap::const_iterator ti =
        this->TotalTargets.begin(); ti != this->TotalTargets.end(); ++ti)
    {
    if ((ti->second)->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    this->WriteSummary(ti->second);
    fout << ti->second->GetSupportDirectory() << "\n";
    }
}